

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O2

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  ParticleFilter *this_00;
  undefined8 uVar1;
  int iVar2;
  pointer pPVar3;
  pointer psVar4;
  pointer pLVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int j;
  ulong uVar11;
  ParticleFilter *this_01;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations_in_map_coordinates;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> map_landmarks_in_range;
  vector<double,_std::allocator<double>_> new_weights;
  vector<Particle,_std::allocator<Particle>_> new_particles;
  undefined1 local_60 [48];
  
  new_particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_particles.super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  new_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  new_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar13 = 0;
  while( true ) {
    pPVar3 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x28) <= uVar13)
    break;
    dVar9 = pPVar3[uVar13].x;
    dVar10 = (&pPVar3[uVar13].x)[1];
    dVar15 = pPVar3[uVar13].theta;
    map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar12 = 4;
    uVar11 = 0;
    while( true ) {
      psVar4 = (map_landmarks->landmark_list).
               super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(map_landmarks->landmark_list).
                         super__Vector_base<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4) / 0xc) <= uVar11
         ) break;
      uVar1 = *(undefined8 *)((long)&psVar4->id_i + lVar12);
      dVar6 = (double)(float)uVar1;
      dVar8 = (double)(float)((ulong)uVar1 >> 0x20);
      dVar14 = dVar6 - dVar9;
      if (SQRT(dVar14 * dVar14 + (dVar8 - dVar10) * (dVar8 - dVar10)) < sensor_range) {
        observations_in_map_coordinates.
        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(observations_in_map_coordinates.
                               super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,
                               *(undefined4 *)((long)psVar4 + lVar12 + -4));
        observations_in_map_coordinates.
        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(dVar8,0);
        observations_in_map_coordinates.
        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)dVar6;
        observations_in_map_coordinates.
        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (int)((ulong)dVar8 >> 0x20);
        std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                  (&map_landmarks_in_range,(value_type *)&observations_in_map_coordinates);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0xc;
    }
    observations_in_map_coordinates.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    observations_in_map_coordinates.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
    _M_impl.super__Vector_impl_data._8_16_ = ZEXT816(0);
    lVar12 = 0x10;
    uVar11 = 0;
    while( true ) {
      pLVar5 = (observations->super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl
               .super__Vector_impl_data._M_start;
      if ((ulong)(((long)(observations->
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)pLVar5) / 0x18) <= uVar11) break;
      iVar2 = *(int *)((long)pLVar5 + lVar12 + -0x10);
      dVar6 = *(double *)((long)pLVar5 + lVar12 + -8);
      dVar8 = *(double *)((long)&pLVar5->id + lVar12);
      dVar14 = cos(dVar15);
      dVar18 = sin(dVar15);
      dVar19 = sin(dVar15);
      dVar7 = cos(dVar15);
      local_60._8_8_ = dVar18 * -dVar8 + dVar14 * dVar6 + dVar9;
      local_60._16_8_ = dVar7 * dVar8 + dVar19 * dVar6 + dVar10;
      local_60._0_4_ = iVar2;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                (&observations_in_map_coordinates,(value_type *)local_60);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    }
    this_00 = (ParticleFilter *)(local_60 + 0x18);
    this_01 = this_00;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)this_00,&map_landmarks_in_range)
    ;
    dataAssociation(this_01,(vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)this_00,
                    &observations_in_map_coordinates);
    std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
              ((_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_> *)this_00);
    lVar12 = 0x10;
    uVar11 = 0;
    dVar15 = 1.0;
    while( true ) {
      if ((ulong)(((long)observations_in_map_coordinates.
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)observations_in_map_coordinates.
                        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18) <= uVar11) break;
      dVar14 = *(double *)
                ((long)observations_in_map_coordinates.
                       super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar12 + -8) - dVar9;
      dVar15 = *(double *)
                ((long)&(observations_in_map_coordinates.
                         super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                         super__Vector_impl_data._M_start)->id + lVar12) - dVar10;
      iVar2 = *(int *)((long)observations_in_map_coordinates.
                             super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12 + -0x10);
      dVar18 = map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2].x - dVar9;
      dVar19 = map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2].y - dVar10;
      dVar6 = atan2(dVar15,dVar14);
      dVar8 = atan2(dVar19,dVar18);
      dVar15 = SQRT(dVar14 * dVar14 + dVar15 * dVar15) - SQRT(dVar18 * dVar18 + dVar19 * dVar19);
      auVar16._0_8_ = dVar15 * dVar15;
      auVar16._8_8_ = (dVar6 - dVar8) * (dVar6 - dVar8);
      dVar15 = *std_landmark;
      dVar6 = std_landmark[1];
      auVar17._8_8_ = (dVar6 + dVar6) * dVar6;
      auVar17._0_8_ = (dVar15 + dVar15) * dVar15;
      auVar17 = divpd(auVar16,auVar17);
      dVar15 = exp(-(auVar17._8_8_ + auVar17._0_8_));
      dVar15 = dVar15 / (*std_landmark * 6.283185307179586 * std_landmark[1]);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    }
    (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13].weight = dVar15;
    (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[uVar13] = dVar15;
    std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
              (&observations_in_map_coordinates.
                super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>);
    std::_Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>::~_Vector_base
              (&map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>
              );
    uVar13 = uVar13 + 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&new_weights.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<Particle,_std::allocator<Particle>_>::~_Vector_base
            (&new_particles.super__Vector_base<Particle,_std::allocator<Particle>_>);
  return;
}

Assistant:

void ParticleFilter::updateWeights(double sensor_range, double std_landmark[], std::vector<LandmarkObs> observations, Map map_landmarks) {
  std::vector<Particle> new_particles;
  std::vector<double> new_weights;
  for (int i=0; i<particles.size(); i++)
  {
    double p_x = particles[i].x;
    double p_y = particles[i].y;
    double p_theta = particles[i].theta;

    // Find map landmarks within the sensor range of the particle
    std::vector<LandmarkObs> map_landmarks_in_range;
    for (int j=0; j<map_landmarks.landmark_list.size(); j++)
    {
      int index = map_landmarks.landmark_list[j].id_i;
      double m_x = map_landmarks.landmark_list[j].x_f;
      double m_y = map_landmarks.landmark_list[j].y_f;
      if (dist(p_x, p_y, m_x, m_y) < sensor_range)
      {
        LandmarkObs l = {index, m_x, m_y};
        map_landmarks_in_range.push_back(l); 
      }
    }

    // Change observation coordinates to map coordinates
    std::vector<LandmarkObs> observations_in_map_coordinates;
    for (int j=0; j<observations.size(); j++)
    {
      int index = observations[j].id;
      double o_x = observations[j].x;
      double o_y = observations[j].y;
      double m_x = p_x + o_x * cos(p_theta) - o_y * sin(p_theta);
      double m_y = p_y + o_x * sin(p_theta) + o_y * cos(p_theta); 
      LandmarkObs l = {index, m_x, m_y};
      observations_in_map_coordinates.push_back(l); 
    }

    // Use the data association method 
    dataAssociation(map_landmarks_in_range, observations_in_map_coordinates);

    // Compute the new weight based on two vectors from point to observation and landmark
    double new_weight = 1.0; 
    for (int j=0; j<observations_in_map_coordinates.size(); j++)
    {
      double o_x = observations_in_map_coordinates[j].x - p_x;
      double o_y = observations_in_map_coordinates[j].y - p_y;
      int map_index = observations_in_map_coordinates[j].id;
      double m_x = map_landmarks_in_range[map_index].x - p_x;
      double m_y = map_landmarks_in_range[map_index].y - p_y;
      double o_length = sqrt(o_x * o_x + o_y * o_y);
      double o_angle = atan2(o_y, o_x);
      double m_length = sqrt(m_x * m_x + m_y * m_y);
      double m_angle = atan2(m_y, m_x);
      double delta_length = o_length - m_length;
      double delta_angle = o_angle - m_angle; 	

      // Bivariate Gaussian
      double num_a = delta_length * delta_length / (2.0 * std_landmark[0] * std_landmark[0]);
      double num_b = delta_angle * delta_angle / (2.0 * std_landmark[1] * std_landmark[1]);
      double numerator = exp(-1.0 * (num_a + num_b));
      double denominator = 2.0 * M_PI * std_landmark[0] * std_landmark[1];
      new_weight = numerator / denominator;
    } 
    particles[i].weight = new_weight;
    weights[i] = new_weight;
  }
}